

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O1

int HandleEvent(SDL_Event *event)

{
  Uint8 UVar1;
  byte bVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  UVar1 = event->type;
  if (UVar1 == '\f') {
    return 1;
  }
  if (UVar1 == '\x02') {
    iVar3 = (event->resize).h;
    if ((iVar3 == 0x67) && (((event->key).keysym.mod & (KMOD_RCTRL|KMOD_LCTRL)) != KMOD_NONE)) {
      HotKey_ToggleGrab();
    }
    if (((event->resize).h == 0x7a) &&
       (((event->key).keysym.mod & (KMOD_RCTRL|KMOD_LCTRL)) != KMOD_NONE)) {
      puts("Ctrl-Z: iconifying window!");
      SDL_WM_IconifyWindow();
    }
    if (((event->resize).h == 0xd) &&
       (((event->key).keysym.mod & (KMOD_RALT|KMOD_LALT)) != KMOD_NONE)) {
      HotKey_ToggleFullScreen();
    }
    uVar4 = SDL_GetKeyName((event->resize).h);
    printf("key \'%s\' pressed\n",uVar4);
    return (uint)(iVar3 == 0x1b);
  }
  if (UVar1 != '\x01') {
    return 0;
  }
  pcVar5 = "gained";
  if ((event->active).gain == '\0') {
    pcVar5 = "lost";
  }
  printf("app %s ",pcVar5);
  bVar2 = (event->active).state;
  if ((bVar2 & 4) == 0) {
    if ((bVar2 & 1) == 0) {
      if ((bVar2 & 2) == 0) goto LAB_00102782;
      pcVar5 = "input ";
    }
    else {
      pcVar5 = "mouse ";
    }
  }
  else {
    pcVar5 = "active ";
  }
  printf(pcVar5);
LAB_00102782:
  puts("focus");
  return 0;
}

Assistant:

int HandleEvent(SDL_Event *event)
{
	int done;

	done = 0;
	switch( event->type ) {
	    case SDL_ACTIVEEVENT:
		/* See what happened */
		printf( "app %s ", event->active.gain ? "gained" : "lost" );
		if ( event->active.state & SDL_APPACTIVE ) {
			printf( "active " );
		} else if ( event->active.state & SDL_APPMOUSEFOCUS ) {
			printf( "mouse " );
		} else if ( event->active.state & SDL_APPINPUTFOCUS ) {
			printf( "input " );
		}
		printf( "focus\n" );
		break;
		

	    case SDL_KEYDOWN:
		if ( event->key.keysym.sym == SDLK_ESCAPE ) {
			done = 1;
		}
		if ( (event->key.keysym.sym == SDLK_g) &&
		     (event->key.keysym.mod & KMOD_CTRL) ) {
			HotKey_ToggleGrab();
		}
		if ( (event->key.keysym.sym == SDLK_z) &&
		     (event->key.keysym.mod & KMOD_CTRL) ) {
			HotKey_Iconify();
		}
		if ( (event->key.keysym.sym == SDLK_RETURN) &&
		     (event->key.keysym.mod & KMOD_ALT) ) {
			HotKey_ToggleFullScreen();
		}
		printf("key '%s' pressed\n", 
			SDL_GetKeyName(event->key.keysym.sym));
		break;
	    case SDL_QUIT:
		done = 1;
		break;
	}
	return(done);
}